

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

void __thiscall sf::priv::WindowImplX11::requestFocus(WindowImplX11 *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  char cVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  undefined8 *puVar7;
  XWindowAttributes attributes;
  Lock local_a0 [11];
  int local_44;
  
  Lock::Lock(local_a0,(Mutex *)&(anonymous_namespace)::allWindowsMutex);
  puVar2 = (anonymous_namespace)::allWindows;
  do {
    puVar7 = puVar2;
    puVar1 = DAT_00219c18;
    if (puVar7 == DAT_00219c18) break;
    cVar3 = (**(code **)(*(long *)*puVar7 + 0x78))();
    puVar2 = puVar7 + 1;
  } while (cVar3 == '\0');
  Lock::~Lock(local_a0);
  iVar4 = XGetWindowAttributes(this->m_display,this->m_window,local_a0);
  if (iVar4 == 0) {
    poVar5 = err();
    poVar5 = std::operator<<(poVar5,"Failed to check if window is viewable while requesting focus");
    std::endl<char,std::char_traits<char>>(poVar5);
  }
  else if ((puVar7 == puVar1) || (local_44 != 2)) {
    lVar6 = XGetWMHints(this->m_display,this->m_window);
    if (lVar6 == 0) {
      lVar6 = XAllocWMHints();
    }
    *(byte *)(lVar6 + 1) = *(byte *)(lVar6 + 1) | 1;
    XSetWMHints(this->m_display,this->m_window,lVar6);
    XFree(lVar6);
  }
  else {
    grabFocus(this);
  }
  return;
}

Assistant:

void WindowImplX11::requestFocus()
{
    // Focus is only stolen among SFML windows, not between applications
    // Check the global list of windows to find out whether an SFML window has the focus
    // Note: can't handle console and other non-SFML windows belonging to the application.
    bool sfmlWindowFocused = false;

    {
        Lock lock(allWindowsMutex);
        for (std::vector<WindowImplX11*>::iterator itr = allWindows.begin(); itr != allWindows.end(); ++itr)
        {
            if ((*itr)->hasFocus())
            {
                sfmlWindowFocused = true;
                break;
            }
        }
    }

    // Check if window is viewable (not on other desktop, ...)
    // TODO: Check also if minimized
    XWindowAttributes attributes;
    if (XGetWindowAttributes(m_display, m_window, &attributes) == 0)
    {
        sf::err() << "Failed to check if window is viewable while requesting focus" << std::endl;
        return; // error getting attribute
    }

    bool windowViewable = (attributes.map_state == IsViewable);

    if (sfmlWindowFocused && windowViewable)
    {
        // Another SFML window of this application has the focus and the current window is viewable:
        // steal focus (i.e. bring window to the front and give it input focus)
        grabFocus();
    }
    else
    {
        // Otherwise: display urgency hint (flashing application logo)
        // Ensure WM hints exist, allocate if necessary
        XWMHints* hints = XGetWMHints(m_display, m_window);
        if (hints == NULL)
            hints = XAllocWMHints();

        // Add urgency (notification) flag to hints
        hints->flags |= XUrgencyHint;
        XSetWMHints(m_display, m_window, hints);
        XFree(hints);
    }
}